

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordQuerySpecification.cpp
# Opt level: O2

void __thiscall
DIS::RecordQuerySpecification::~RecordQuerySpecification(RecordQuerySpecification *this)

{
  ~RecordQuerySpecification(this);
  operator_delete(this);
  return;
}

Assistant:

RecordQuerySpecification::~RecordQuerySpecification()
{
    _records.clear();
}